

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlat<unsigned_int,unsigned_int,unsigned_int,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseXOROperator,bool,false,true>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  uint *ldata;
  uint *rdata;
  unsigned_long *puVar1;
  uint *result_data;
  
  ldata = (uint *)left->data;
  rdata = (uint *)right->data;
  puVar1 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ConstantVector::SetNull(result,true);
    return;
  }
  Vector::SetVectorType(result,FLAT_VECTOR);
  result_data = (uint *)result->data;
  FlatVector::VerifyFlatVector(result);
  FlatVector::VerifyFlatVector(left);
  FlatVector::VerifyFlatVector(result);
  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
       (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
            (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
             &(left->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
  (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
       (left->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
  ExecuteFlatLoop<unsigned_int,unsigned_int,unsigned_int,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseXOROperator,bool,false,true>
            (ldata,rdata,result_data,count,&result->validity,fun);
  return;
}

Assistant:

static void ExecuteFlat(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if ((LEFT_CONSTANT && ConstantVector::IsNull(left)) || (RIGHT_CONSTANT && ConstantVector::IsNull(right))) {
			// either left or right is constant NULL: result is constant NULL
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		auto &result_validity = FlatVector::Validity(result);
		if (LEFT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(right), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(right));
			}
		} else if (RIGHT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
			}
		} else {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
				if (result_validity.AllValid()) {
					result_validity.Copy(FlatVector::Validity(right), count);
				} else {
					result_validity.Combine(FlatVector::Validity(right), count);
				}
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
				result_validity.Combine(FlatVector::Validity(right), count);
			}
		}
		ExecuteFlatLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, result_data, count, result_validity, fun);
	}